

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

void __thiscall
soul::StructuralParser::parseEndpoint
          (StructuralParser *this,ProcessorBase *p,bool isInput,EndpointType endpointType)

{
  void **ppvVar1;
  Allocator *pAVar2;
  bool bVar3;
  PoolItem *pPVar4;
  PoolItem *pPVar5;
  undefined1 local_68 [44];
  uint local_3c;
  vector<soul::pool_ref<soul::AST::EndpointDeclaration>,std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>>>
  *local_38;
  
  pAVar2 = this->allocator;
  local_68._0_8_ = (this->super_SOULTokeniser).location.sourceCode.object;
  if ((EndpointDeclaration *)local_68._0_8_ != (EndpointDeclaration *)0x0) {
    *(uint32_t *)&(((EndpointDeclaration *)local_68._0_8_)->super_ASTObject)._vptr_ASTObject =
         *(uint32_t *)&(((EndpointDeclaration *)local_68._0_8_)->super_ASTObject)._vptr_ASTObject +
         1;
  }
  local_68._8_8_ = (this->super_SOULTokeniser).location.location.data;
  local_68._16_8_ = this->currentScope;
  pPVar4 = PoolAllocator::allocateSpaceForObject(&pAVar2->pool,0x78);
  ppvVar1 = &pPVar4->item;
  local_3c = (uint)isInput;
  AST::EndpointDeclaration::EndpointDeclaration
            ((EndpointDeclaration *)ppvVar1,pAVar2,(Context *)local_68,isInput,endpointType);
  pPVar4->destructor =
       PoolAllocator::
       allocate<soul::AST::EndpointDeclaration,_soul::AST::Allocator_&,_soul::AST::Context,_bool_&,_soul::EndpointType_&>
       ::anon_class_1_0_00000001::__invoke;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_68._0_8_);
  parseEndpointTypeList
            ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *)local_68,this,
             endpointType);
  if (pPVar4[2].destructor == (DestructorFn *)0x0) {
    throwInternalCompilerError("object != nullptr","operator*",0x3b);
  }
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::operator=
            ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *)
             (pPVar4[2].destructor + 8),
             (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *)local_68);
  local_68._8_8_ = (char *)0x0;
  if ((Scope *)0x2 < (ulong)local_68._16_8_) {
    if ((EndpointDeclaration *)local_68._0_8_ != (EndpointDeclaration *)0x0) {
      operator_delete__((void *)local_68._0_8_);
    }
    local_68._0_8_ = local_68 + 0x18;
    local_68._16_8_ = (Scope *)0x2;
  }
  parseInputOrOutputName(this,(EndpointDeclaration *)ppvVar1);
  local_38 = (vector<soul::pool_ref<soul::AST::EndpointDeclaration>,std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>>>
              *)&p->endpoints;
  local_68._0_8_ = ppvVar1;
  std::
  vector<soul::pool_ref<soul::AST::EndpointDeclaration>,std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>>>
  ::emplace_back<soul::pool_ref<soul::AST::EndpointDeclaration>>
            (local_38,(pool_ref<soul::AST::EndpointDeclaration> *)local_68);
  bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x26375e);
  if (bVar3) {
    do {
      pAVar2 = this->allocator;
      local_68._0_8_ = (this->super_SOULTokeniser).location.sourceCode.object;
      if ((EndpointDeclaration *)local_68._0_8_ != (EndpointDeclaration *)0x0) {
        *(uint32_t *)&(((EndpointDeclaration *)local_68._0_8_)->super_ASTObject)._vptr_ASTObject =
             *(uint32_t *)
              &(((EndpointDeclaration *)local_68._0_8_)->super_ASTObject)._vptr_ASTObject + 1;
      }
      local_68._8_8_ = (this->super_SOULTokeniser).location.location.data;
      local_68._16_8_ = this->currentScope;
      pPVar5 = PoolAllocator::allocateSpaceForObject(&pAVar2->pool,0x78);
      ppvVar1 = &pPVar5->item;
      AST::EndpointDeclaration::EndpointDeclaration
                ((EndpointDeclaration *)ppvVar1,pAVar2,(Context *)local_68,SUB41(local_3c,0),
                 endpointType);
      pPVar5->destructor =
           PoolAllocator::
           allocate<soul::AST::EndpointDeclaration,_soul::AST::Allocator_&,_soul::AST::Context,_bool_&,_soul::EndpointType_&>
           ::anon_class_1_0_00000001::__invoke;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_68._0_8_);
      if ((pPVar4[2].destructor == (DestructorFn *)0x0) ||
         (pPVar5[2].destructor == (DestructorFn *)0x0)) {
        throwInternalCompilerError("object != nullptr","operator*",0x3b);
      }
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::operator=
                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *)
                 (pPVar5[2].destructor + 8),
                 (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *)
                 (pPVar4[2].destructor + 8));
      parseInputOrOutputName(this,(EndpointDeclaration *)ppvVar1);
      local_68._0_8_ = ppvVar1;
      std::
      vector<soul::pool_ref<soul::AST::EndpointDeclaration>,std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>>>
      ::emplace_back<soul::pool_ref<soul::AST::EndpointDeclaration>>
                (local_38,(pool_ref<soul::AST::EndpointDeclaration> *)local_68);
      bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x26375e);
    } while (bVar3);
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x261d5f);
  return;
}

Assistant:

void parseEndpoint (AST::ProcessorBase& p, bool isInput, EndpointType endpointType)
    {
        auto& first = allocate<AST::EndpointDeclaration> (allocator, getContext(), isInput, endpointType);
        first.getDetails().dataTypes = parseEndpointTypeList (endpointType);
        parseInputOrOutputName (first);
        p.endpoints.push_back (first);

        while (matchIf (Operator::comma))
        {
            auto& e = allocate<AST::EndpointDeclaration> (allocator, getContext(), isInput, endpointType);
            e.getDetails().dataTypes = first.getDetails().dataTypes;
            parseInputOrOutputName (e);
            p.endpoints.push_back (e);
        }

        expect (Operator::semicolon);
    }